

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_pointer_based_iterator.cpp
# Opt level: O3

void __thiscall PointerBasedIterator_IPlusN_Test::TestBody(PointerBasedIterator_IPlusN_Test *this)

{
  char *pcVar1;
  AssertionResult gtest_ar;
  array<int,_2UL> arr;
  AssertHelper local_38;
  pointer_based_iterator<int> local_30;
  internal local_28 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_20;
  undefined8 local_18;
  
  local_30.pos_ = (pointer)&stack0xfffffffffffffff0;
  local_38.data_ = (AssertHelperData *)&stack0xfffffffffffffff0;
  local_18 = 0x300000001;
  testing::internal::
  CmpHelperEQ<pstore::pointer_based_iterator<int>,pstore::pointer_based_iterator<int>>
            (local_28,"i + 2","iterator{&arr[0] + 2}",&local_30,
             (pointer_based_iterator<int> *)&local_38);
  if (local_28[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_30);
    if (local_20 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_20->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_pointer_based_iterator.cpp"
               ,0x60,pcVar1);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if ((long *)local_30.pos_ != (long *)0x0) {
      (**(code **)(*(long *)local_30.pos_ + 8))();
    }
  }
  if (local_20 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_20,local_20);
  }
  local_38.data_ = (AssertHelperData *)&stack0xfffffffffffffff0;
  local_30.pos_ = (pointer)&stack0xfffffffffffffff0;
  testing::internal::
  CmpHelperEQ<pstore::pointer_based_iterator<int>,pstore::pointer_based_iterator<int>>
            (local_28,"i + 2","2 + i",&local_30,(pointer_based_iterator<int> *)&local_38);
  if (local_28[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_30);
    if (local_20 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_20->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_pointer_based_iterator.cpp"
               ,0x62,pcVar1);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if ((long *)local_30.pos_ != (long *)0x0) {
      (**(code **)(*(long *)local_30.pos_ + 8))();
    }
  }
  if (local_20 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_20,local_20);
  }
  return;
}

Assistant:

TEST_F (PointerBasedIterator, IPlusN) {
    std::array<int, 2> arr{{1, 3}};
    iterator i{&arr[0]};
    EXPECT_EQ (i + 2, iterator{&arr[0] + 2});
    // Check i+n and n+i
    EXPECT_EQ (i + 2, 2 + i);
}